

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_type __thiscall
phmap::container_internal::
parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::erase<unsigned_long>
          (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           *this,key_arg<unsigned_long> *key)

{
  raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  *this_00;
  undefined1 auVar1 [16];
  size_t hash;
  ulong uVar2;
  bool bVar3;
  iterator it;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *key;
  hash = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
         SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0);
  uVar2 = (ulong)((((uint)(hash >> 4) & 0xfffffff ^ (uint)hash) & 0xf) << 6);
  this_00 = (raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
             *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + uVar2);
  it = raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
       ::find<unsigned_long>(this_00,key,hash);
  bVar3 = it.ctrl_ !=
          (ctrl_t *)
          (*(long *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ + uVar2) +
          *(long *)((long)&(this->sets_)._M_elems[0].set_.capacity_ + uVar2));
  if (bVar3) {
    raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
    ::_erase(this_00,it);
  }
  return (ulong)bVar3;
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto hashval = HashElement{hash_ref()}(key);
        Inner& inner = sets_[subidx(hashval)];
        auto&  set   = inner.set_;
        typename Lockable::UpgradeLock m(inner);
        auto it   = set.find(key, hashval);
        if (it == set.end()) 
            return 0;

        typename Lockable::UpgradeToUnique unique(m);
        set._erase(it);
        return 1;
    }